

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-info.cpp
# Opt level: O0

void __thiscall
FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor>::~FileInfoWrapper
          (FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> *this)

{
  FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> *this_local;
  
  ~FileInfoWrapper(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

virtual ~FileInfoWrapper() {}